

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_NewGlobalCConstructor2(JSContext *ctx,JSValue func_obj,char *name,JSValue proto)

{
  JSValue v;
  JSValue val;
  JSValue func_obj_00;
  JSValue this_obj;
  JSValue v_00;
  JSContext *in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  int in_R8D;
  JSValue JVar1;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSContext *pJVar4;
  
  v_00.tag = in_RDX;
  v_00.u.float64 = in_RSI.float64;
  JVar2 = in_RDI;
  pJVar4 = in_RCX;
  JVar1 = JS_DupValue((JSContext *)in_RDI.ptr,v_00);
  JVar3 = JVar1.u;
  this_obj.tag = (int64_t)pJVar4;
  this_obj.u = (JSValueUnion)(JSValueUnion)JVar1.tag;
  val.tag = (int64_t)JVar3.ptr;
  val.u.ptr = JVar2.ptr;
  JS_DefinePropertyValueStr(in_RCX,this_obj,(char *)in_RDI.ptr,val,in_R8D);
  func_obj_00.tag = (int64_t)JVar3.ptr;
  func_obj_00.u.ptr = JVar2.ptr;
  JVar1.tag = (int64_t)in_RCX;
  JVar1.u.ptr = in_RDI.ptr;
  JS_SetConstructor(in_stack_ffffffffffffffa0,func_obj_00,JVar1);
  v.tag = (int64_t)in_RCX;
  v.u.ptr = in_RDI.ptr;
  JS_FreeValue(in_stack_ffffffffffffffa0,v);
  return;
}

Assistant:

static void JS_NewGlobalCConstructor2(JSContext *ctx,
                                      JSValue func_obj,
                                      const char *name,
                                      JSValueConst proto)
{
    JS_DefinePropertyValueStr(ctx, ctx->global_obj, name,
                           JS_DupValue(ctx, func_obj),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    JS_SetConstructor(ctx, func_obj, proto);
    JS_FreeValue(ctx, func_obj);
}